

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushStyleColor(ImGuiCol idx,ImVec4 *col)

{
  undefined8 *puVar1;
  undefined1 local_34 [8];
  ImGuiColorMod backup;
  ImGuiContext_conflict *g;
  ImVec4 *col_local;
  ImGuiCol idx_local;
  
  backup.BackupValue._8_8_ = GImGui;
  ImGuiColorMod::ImGuiColorMod((ImGuiColorMod *)local_34);
  puVar1 = (undefined8 *)(backup.BackupValue._8_8_ + 0x1708 + (long)idx * 0x10);
  unique0x00012000 = *puVar1;
  backup.BackupValue._0_8_ = puVar1[1];
  local_34._0_4_ = idx;
  ImVector<ImGuiColorMod>::push_back
            ((ImVector<ImGuiColorMod> *)(backup.BackupValue._8_8_ + 0x1ea8),
             (ImGuiColorMod *)local_34);
  puVar1 = (undefined8 *)(backup.BackupValue._8_8_ + 0x1708 + (long)idx * 0x10);
  *puVar1 = *(undefined8 *)col;
  puVar1[1] = *(undefined8 *)&col->z;
  return;
}

Assistant:

void ImGui::PushStyleColor(ImGuiCol idx, const ImVec4& col)
{
    ImGuiContext& g = *GImGui;
    ImGuiColorMod backup;
    backup.Col = idx;
    backup.BackupValue = g.Style.Colors[idx];
    g.ColorStack.push_back(backup);
    g.Style.Colors[idx] = col;
}